

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O0

void ihevc_sao_edge_offset_class3
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  byte bVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 *in_R8;
  byte *in_R9;
  byte *in_stack_00000008;
  char *in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  WORD32 edge_idx_2;
  WORD32 edge_idx_1;
  WORD32 edge_idx;
  UWORD8 u1_pos_wd_0_tmp;
  UWORD8 u1_pos_0_ht_tmp;
  WORD32 bit_depth;
  WORD8 u1_sign_down;
  UWORD8 *pu1_src_left_cpy;
  WORD8 au1_sign_up [64];
  UWORD8 u1_src_top_left_tmp;
  UWORD8 au1_src_left_tmp [64];
  UWORD8 au1_src_top_tmp [64];
  UWORD8 au1_mask [64];
  WORD32 col;
  WORD32 row;
  int local_1d8;
  int local_1c8;
  char local_1b4;
  uint local_1ac;
  uint local_1a4;
  char local_18c;
  uint local_188;
  uint local_180;
  char local_178;
  uint local_174;
  uint local_16c;
  char local_15a;
  char local_159;
  long local_150;
  char acStack_148 [79];
  undefined1 local_f9;
  undefined1 auStack_f8 [64];
  undefined1 auStack_b8 [64];
  byte local_78 [64];
  int local_38;
  int local_34;
  byte *local_30;
  undefined1 *local_28;
  long local_20;
  long local_18;
  int local_c;
  long local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_78,0xff,0x40);
  local_f9 = *(undefined1 *)(local_20 + (in_stack_00000020 + -1));
  for (local_34 = 0; local_34 < in_stack_00000028; local_34 = local_34 + 1) {
    auStack_f8[local_34] = *(undefined1 *)(local_8 + (local_34 * local_c + in_stack_00000020 + -1));
  }
  for (local_38 = 0; local_38 < in_stack_00000020; local_38 = local_38 + 1) {
    auStack_b8[local_38] =
         *(undefined1 *)(local_8 + ((in_stack_00000028 + -1) * local_c + local_38));
  }
  if (in_stack_00000010[5] == '\0') {
    local_15a = *(char *)(local_8 + (in_stack_00000020 + -1));
  }
  else {
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000020 + -1)) - (uint)*local_30) < 0) {
      local_16c = 0xffffffff;
    }
    else {
      local_16c = (uint)(0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000020 + -1)) -
                                  (uint)*local_30));
    }
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000020 + -1)) -
             (uint)*(byte *)(local_8 + (in_stack_00000020 + -2 + local_c))) < 0) {
      local_174 = 0xffffffff;
    }
    else {
      local_174 = (uint)(0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000020 + -1)) -
                                  (uint)*(byte *)(local_8 + (in_stack_00000020 + -2 + local_c))));
    }
    iVar2 = gi4_ihevc_table_edge_idx[(int)(local_16c + 2 + local_174)];
    if (iVar2 == 0) {
      local_15a = *(char *)(local_8 + (in_stack_00000020 + -1));
    }
    else {
      if ((int)((uint)*(byte *)(local_8 + (in_stack_00000020 + -1)) +
               (int)*(char *)(in_stack_00000018 + iVar2)) < 0x100) {
        if ((int)((uint)*(byte *)(local_8 + (in_stack_00000020 + -1)) +
                 (int)*(char *)(in_stack_00000018 + iVar2)) < 0) {
          local_178 = '\0';
        }
        else {
          local_178 = *(char *)(local_8 + (in_stack_00000020 + -1)) +
                      *(char *)(in_stack_00000018 + iVar2);
        }
      }
      else {
        local_178 = -1;
      }
      local_15a = local_178;
    }
  }
  if (in_stack_00000010[6] == '\0') {
    local_159 = *(char *)(local_8 + (in_stack_00000028 + -1) * local_c);
  }
  else {
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1) * local_c) -
             (uint)*(byte *)(local_8 + (((in_stack_00000028 + -1) * local_c + 1) - local_c))) < 0) {
      local_180 = 0xffffffff;
    }
    else {
      local_180 = (uint)(0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1) * local_c) -
                                  (uint)*(byte *)(local_8 +
                                                 (((in_stack_00000028 + -1) * local_c + 1) - local_c
                                                 ))));
    }
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1) * local_c) -
             (uint)*in_stack_00000008) < 0) {
      local_188 = 0xffffffff;
    }
    else {
      local_188 = (uint)(0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1) * local_c) -
                                  (uint)*in_stack_00000008));
    }
    iVar2 = gi4_ihevc_table_edge_idx[(int)(local_180 + 2 + local_188)];
    if (iVar2 == 0) {
      local_159 = *(char *)(local_8 + (in_stack_00000028 + -1) * local_c);
    }
    else {
      if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1) * local_c) +
               (int)*(char *)(in_stack_00000018 + iVar2)) < 0x100) {
        if ((int)((uint)*(byte *)(local_8 + (in_stack_00000028 + -1) * local_c) +
                 (int)*(char *)(in_stack_00000018 + iVar2)) < 0) {
          local_18c = '\0';
        }
        else {
          local_18c = *(char *)(local_8 + (in_stack_00000028 + -1) * local_c) +
                      *(char *)(in_stack_00000018 + iVar2);
        }
      }
      else {
        local_18c = -1;
      }
      local_159 = local_18c;
    }
  }
  if (*in_stack_00000010 == '\0') {
    local_78[0] = 0;
  }
  if (in_stack_00000010[2] == '\0') {
    local_8 = local_8 + local_c;
    in_stack_00000028 = in_stack_00000028 + -1;
    local_150 = in_RDX + 1;
    for (local_38 = 0; local_38 < in_stack_00000020 + -1; local_38 = local_38 + 1) {
      if ((int)((uint)*(byte *)(local_8 + local_38) -
               (uint)*(byte *)(local_8 + ((local_38 + 1) - local_c))) < 0) {
        cVar3 = -1;
      }
      else {
        cVar3 = 0 < (int)((uint)*(byte *)(local_8 + local_38) -
                         (uint)*(byte *)(local_8 + ((local_38 + 1) - local_c)));
      }
      acStack_148[local_38] = cVar3;
    }
  }
  else {
    for (local_38 = 0; local_150 = in_RDX, local_38 < in_stack_00000020 + -1;
        local_38 = local_38 + 1) {
      if ((int)((uint)*(byte *)(local_8 + local_38) - (uint)*(byte *)(local_20 + (local_38 + 1))) <
          0) {
        cVar3 = -1;
      }
      else {
        cVar3 = 0 < (int)((uint)*(byte *)(local_8 + local_38) -
                         (uint)*(byte *)(local_20 + (local_38 + 1)));
      }
      acStack_148[local_38] = cVar3;
    }
  }
  if (in_stack_00000010[1] == '\0') {
    local_78[in_stack_00000020 + -1] = 0;
  }
  if (in_stack_00000010[3] == '\0') {
    in_stack_00000028 = in_stack_00000028 + -1;
  }
  for (local_34 = 0; local_34 < in_stack_00000028; local_34 = local_34 + 1) {
    if ((int)((uint)*(byte *)(local_8 + (in_stack_00000020 + -1)) -
             (uint)*(byte *)(local_8 + (in_stack_00000020 - local_c))) < 0) {
      cVar3 = -1;
    }
    else {
      cVar3 = 0 < (int)((uint)*(byte *)(local_8 + (in_stack_00000020 + -1)) -
                       (uint)*(byte *)(local_8 + (in_stack_00000020 - local_c)));
    }
    acStack_148[in_stack_00000020 + -1] = cVar3;
    for (local_38 = 0; local_38 < in_stack_00000020; local_38 = local_38 + 1) {
      if (local_38 == 0) {
        bVar1 = *(byte *)(local_150 + (local_34 + 1));
      }
      else {
        bVar1 = *(byte *)(local_8 + (local_38 + -1 + local_c));
      }
      local_1a4 = (uint)bVar1;
      if ((int)(*(byte *)(local_8 + local_38) - local_1a4) < 0) {
        cVar3 = -1;
      }
      else {
        if (local_38 == 0) {
          bVar1 = *(byte *)(local_150 + (local_34 + 1));
        }
        else {
          bVar1 = *(byte *)(local_8 + (local_38 + -1 + local_c));
        }
        local_1ac = (uint)bVar1;
        cVar3 = 0 < (int)(*(byte *)(local_8 + local_38) - local_1ac);
      }
      lVar5 = (long)local_38;
      if (0 < local_38) {
        acStack_148[local_38 + -1] = -cVar3;
      }
      uVar4 = gi4_ihevc_table_edge_idx[acStack_148[lVar5] + 2 + (int)cVar3] &
              (uint)local_78[local_38];
      if (uVar4 != 0) {
        if ((int)((uint)*(byte *)(local_8 + local_38) +
                 (int)*(char *)(in_stack_00000018 + (int)uVar4)) < 0x100) {
          if ((int)((uint)*(byte *)(local_8 + local_38) +
                   (int)*(char *)(in_stack_00000018 + (int)uVar4)) < 0) {
            local_1b4 = '\0';
          }
          else {
            local_1b4 = *(char *)(local_8 + local_38) + *(char *)(in_stack_00000018 + (int)uVar4);
          }
        }
        else {
          local_1b4 = -1;
        }
        *(char *)(local_8 + local_38) = local_1b4;
      }
    }
    local_8 = local_8 + local_c;
  }
  if (in_stack_00000010[2] == '\0') {
    local_1c8 = in_stack_00000028 + 1;
  }
  else {
    local_1c8 = in_stack_00000028;
  }
  *(char *)(local_8 + (-local_1c8 * local_c + in_stack_00000020 + -1)) = local_15a;
  if (in_stack_00000010[3] == '\0') {
    local_1d8 = 0;
  }
  else {
    local_1d8 = -local_c;
  }
  *(char *)(local_8 + local_1d8) = local_159;
  if (in_stack_00000010[2] == '\0') {
    in_stack_00000028 = in_stack_00000028 + 1;
  }
  if (in_stack_00000010[3] == '\0') {
    in_stack_00000028 = in_stack_00000028 + 1;
  }
  *local_28 = local_f9;
  for (local_34 = 0; local_34 < in_stack_00000028; local_34 = local_34 + 1) {
    *(undefined1 *)(local_18 + local_34) = auStack_f8[local_34];
  }
  for (local_38 = 0; local_38 < in_stack_00000020; local_38 = local_38 + 1) {
    *(undefined1 *)(local_20 + local_38) = auStack_b8[local_38];
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class3(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[MAX_CTB_SIZE];
    UWORD8 u1_src_top_left_tmp;
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    UWORD8 *pu1_src_left_cpy;
    WORD8 u1_sign_down;
    WORD32 bit_depth;

    UWORD8 u1_pos_0_ht_tmp;
    UWORD8 u1_pos_wd_0_tmp;

    bit_depth = BIT_DEPTH_LUMA;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    u1_src_top_left_tmp = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* If top-right is available, process separately */
    if(0 != pu1_avail[5])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[wd - 1] - pu1_src_top_right[0]) +
                        SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 - 1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp = CLIP3(pu1_src[wd - 1] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp = pu1_src[wd - 1];
        }
    }
    else
    {
        u1_pos_wd_0_tmp = pu1_src[wd - 1];
    }

    /* If bottom-left is available, process separately */
    if(0 != pu1_avail[6])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src[(ht - 1) * src_strd + 1 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src_bot_left[0]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp = CLIP3(pu1_src[(ht - 1) * src_strd] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp = pu1_src[(ht - 1) * src_strd];
        }
    }
    else
    {
        u1_pos_0_ht_tmp = pu1_src[(ht - 1) * src_strd];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 1;
        for(col = 0; col < wd - 1; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col + 1 - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd - 1; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col + 1]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[wd - 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            au1_sign_up[wd - 1] = SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 + 1 - src_strd]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_down = SIGN(pu1_src[col] - ((col == 0) ? pu1_src_left_cpy[row + 1] :
                                                                 pu1_src[col - 1 + src_strd]));
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                if(col > 0)
                    au1_sign_up[col - 1] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 1] = u1_pos_wd_0_tmp;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0)] = u1_pos_0_ht_tmp;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    *pu1_src_top_left = u1_src_top_left_tmp;
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}